

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_lws_mirror.c
# Opt level: O0

int callback_lws_mirror(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  mirror_instance *mi_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  lws_vhost *plVar6;
  lws_protocols *plVar7;
  char *pcVar8;
  lws_ring *plVar9;
  size_t sVar10;
  long *local_1d0;
  mirror_instance **pmi;
  per_session_data__lws_mirror **___ppss;
  mirror_instance *mi1;
  int count_mi;
  int n;
  uint32_t oldest_tail;
  a_message amsg;
  a_message *msg;
  mirror_instance *mi;
  char *pn;
  undefined1 local_178 [6];
  char sent_something;
  char update_worst;
  char name [300];
  per_vhost_data__lws_mirror *v;
  per_session_data__lws_mirror *pss;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  plVar6 = lws_get_vhost(wsi);
  plVar7 = lws_get_protocol(wsi);
  register0x00000000 = (long *)lws_protocol_vh_priv_get(plVar6,plVar7);
  mi = (mirror_instance *)local_178;
  msg = (a_message *)0x0;
  mi1._4_4_ = 0;
  switch(reason) {
  case LWS_CALLBACK_ESTABLISHED:
    _lws_log(8,"%s: LWS_CALLBACK_ESTABLISHED\n","callback_lws_mirror");
    local_178[0] = '\0';
    pcVar8 = lws_get_urlarg_by_name(wsi,"mirror",local_178,299);
    if (pcVar8 == (char *)0x0) {
      _lws_log(0x10,"get urlarg failed\n");
    }
    pcVar8 = strchr(local_178,0x3d);
    if (pcVar8 != (char *)0x0) {
      pcVar8 = strchr(local_178,0x3d);
      mi = (mirror_instance *)(pcVar8 + 1);
    }
    for (___ppss = (per_session_data__lws_mirror **)*stack0xffffffffffffffb8;
        ___ppss != (per_session_data__lws_mirror **)0x0;
        ___ppss = (per_session_data__lws_mirror **)*___ppss) {
      mi1._4_4_ = mi1._4_4_ + 1;
      iVar5 = strcmp((char *)mi,(char *)((long)___ppss + 0x1c));
      if (iVar5 == 0) {
        msg = (a_message *)___ppss;
        break;
      }
    }
    if (msg == (a_message *)0x0) {
      if (mi1._4_4_ == 3) {
        return -1;
      }
      msg = (a_message *)malloc(0x40);
      if (msg == (a_message *)0x0) {
        return 1;
      }
      memset(msg,0,0x40);
      plVar9 = lws_ring_create(0x10,0x20,__mirror_destroy_message);
      msg[1].payload = plVar9;
      if (msg[1].payload == (void *)0x0) {
        free(msg);
        return 1;
      }
      msg->payload = (void *)*stack0xffffffffffffffb8;
      *stack0xffffffffffffffb8 = (long)msg;
      lws_snprintf((char *)((long)&msg[1].len + 4),0x1d,"%s",mi);
      *(undefined1 *)((long)&msg[3].len + 2) = 1;
      _lws_log(4,"Created new mi %p \'%s\'\n",msg,mi);
    }
    *(size_t *)((long)user + 0x10) = msg->len;
    msg->len = (size_t)user;
    *(a_message **)((long)user + 8) = msg;
    uVar2 = lws_ring_get_oldest_tail((lws_ring *)msg[1].payload);
    *(uint32_t *)((long)user + 0x18) = uVar2;
    *(lws **)user = wsi;
    break;
  default:
    break;
  case LWS_CALLBACK_CLOSED:
    mi_00 = *(mirror_instance **)((long)user + 8);
    if (mi_00 != (mirror_instance *)0x0) {
      for (pmi = (mirror_instance **)&mi_00->same_mi_pss_list; *pmi != (mirror_instance *)0x0;
          pmi = (mirror_instance **)&(*pmi)->ring) {
        if (*pmi == (mirror_instance *)user) {
          *pmi = *(mirror_instance **)((long)user + 0x10);
          break;
        }
      }
      *(undefined8 *)((long)user + 8) = 0;
      local_1d0 = register0x00000000;
      if (mi_00->same_mi_pss_list == (per_session_data__lws_mirror *)0x0) {
        for (; *local_1d0 != 0; local_1d0 = (long *)*local_1d0) {
          if ((mirror_instance *)*local_1d0 == mi_00) {
            *local_1d0 = *(long *)*local_1d0;
            lws_ring_destroy(mi_00->ring);
            free(mi_00);
            return 0;
          }
        }
      }
      else {
        __mirror_update_worst_tail(mi_00);
      }
    }
    break;
  case LWS_CALLBACK_RECEIVE:
    sVar10 = lws_ring_get_count_free_elements(*(lws_ring **)(*(long *)((long)user + 8) + 0x10));
    if ((int)sVar10 == 0) {
      _lws_log(4,"dropping!\n");
      if (*(char *)(*(long *)((long)user + 8) + 0x3a) != '\0') {
        __mirror_rxflow_instance(*(mirror_instance **)((long)user + 8),0);
      }
    }
    else {
      _n = malloc(len + 0x10);
      amsg.payload = (void *)len;
      if (_n == (void *)0x0) {
        _lws_log(4,"OOM: dropping\n");
        return 0;
      }
      memcpy((void *)((long)_n + 0x10),in,len);
      sVar10 = lws_ring_insert(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),&n,1);
      if (sVar10 == 0) {
        __mirror_destroy_message(&n);
        _lws_log(4,"dropping!\n");
        if (*(char *)(*(long *)((long)user + 8) + 0x3a) != '\0') {
          __mirror_rxflow_instance(*(mirror_instance **)((long)user + 8),0);
        }
      }
      else if ((*(char *)(*(long *)((long)user + 8) + 0x3a) != '\0') &&
              (sVar10 = lws_ring_get_count_free_elements
                                  (*(lws_ring **)(*(long *)((long)user + 8) + 0x10)), sVar10 < 4)) {
        __mirror_rxflow_instance(*(mirror_instance **)((long)user + 8),0);
      }
    }
    __mirror_callback_all_in_mi_on_writable(*(mirror_instance **)((long)user + 8));
    break;
  case LWS_CALLBACK_SERVER_WRITEABLE:
    uVar3 = lws_ring_get_oldest_tail(*(lws_ring **)(*(long *)((long)user + 8) + 0x10));
    uVar2 = *(uint32_t *)((long)user + 0x18);
    bVar1 = false;
    do {
      amsg.len = (size_t)lws_ring_get_element
                                   (*(lws_ring **)(*(long *)((long)user + 8) + 0x10),
                                    (uint32_t *)((long)user + 0x18));
      if ((long *)amsg.len == (long *)0x0) break;
      if (*(long *)amsg.len == 0) {
        _lws_log(1,"%s: NULL payload: worst = %d, pss->tail = %d\n","callback_lws_mirror",
                 (ulong)uVar3,(ulong)*(uint *)((long)user + 0x18));
        sVar10 = lws_ring_consume(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),
                                  (uint32_t *)((long)user + 0x18),(void *)0x0,1);
        if (sVar10 == 0) break;
      }
      else {
        uVar4 = lws_write(wsi,(uchar *)(*(long *)amsg.len + 0x10),*(size_t *)(amsg.len + 8),
                          LWS_WRITE_TEXT);
        if ((int)uVar4 < 0) {
          _lws_log(8,"%s: WRITEABLE: %d\n","callback_lws_mirror",(ulong)uVar4);
          return -1;
        }
        bVar1 = true;
        lws_ring_consume(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),
                         (uint32_t *)((long)user + 0x18),(void *)0x0,1);
      }
      iVar5 = lws_send_pipe_choked(wsi);
    } while (iVar5 == 0);
    sVar10 = lws_ring_get_count_waiting_elements
                       (*(lws_ring **)(*(long *)((long)user + 8) + 0x10),
                        (uint32_t *)((long)user + 0x18));
    if (sVar10 != 0) {
      lws_callback_on_writable(wsi);
    }
    if ((bVar1) && (uVar3 == uVar2)) {
      lws_set_timeout(*user,NO_PENDING_TIMEOUT,0);
      __mirror_update_worst_tail(*(mirror_instance **)((long)user + 8));
    }
    break;
  case LWS_CALLBACK_CONFIRM_EXTENSION_OKAY:
    return 1;
  case LWS_CALLBACK_PROTOCOL_INIT:
    plVar6 = lws_get_vhost(wsi);
    plVar7 = lws_get_protocol(wsi);
    lws_protocol_vh_priv_zalloc(plVar6,plVar7,8);
    plVar6 = lws_get_vhost(wsi);
    plVar7 = lws_get_protocol(wsi);
    lws_protocol_vh_priv_get(plVar6,plVar7);
    break;
  case LWS_CALLBACK_PROTOCOL_DESTROY:
    break;
  case LWS_CALLBACK_EVENT_WAIT_CANCELLED:
    _lws_log(8,"LWS_CALLBACK_EVENT_WAIT_CANCELLED\n");
  }
  return 0;
}

Assistant:

static int
callback_lws_mirror(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	struct per_session_data__lws_mirror *pss =
			(struct per_session_data__lws_mirror *)user;
	struct per_vhost_data__lws_mirror *v =
			(struct per_vhost_data__lws_mirror *)
			lws_protocol_vh_priv_get(lws_get_vhost(wsi),
						 lws_get_protocol(wsi));
	char name[300], update_worst, sent_something, *pn = name;
	struct mirror_instance *mi = NULL;
	const struct a_message *msg;
	struct a_message amsg;
	uint32_t oldest_tail;
	int n, count_mi = 0;

	switch (reason) {
	case LWS_CALLBACK_ESTABLISHED:
		lwsl_info("%s: LWS_CALLBACK_ESTABLISHED\n", __func__);

		/*
		 * mirror instance name... defaults to "", but if URL includes
		 * "?mirror=xxx", will be "xxx"
		 */
		name[0] = '\0';
		if (!lws_get_urlarg_by_name(wsi, "mirror", name,
					   sizeof(name) - 1))
			lwsl_debug("get urlarg failed\n");
		if (strchr(name, '='))
			pn = strchr(name, '=') + 1;

		//lwsl_notice("%s: mirror name '%s'\n", __func__, pn);

		/* is there already a mirror instance of this name? */

		lws_pthread_mutex_lock(&v->lock); /* vhost lock { */

		lws_start_foreach_ll(struct mirror_instance *, mi1,
				     v->mi_list) {
			count_mi++;
			if (!strcmp(pn, mi1->name)) {
				/* yes... we will join it */
				mi = mi1;
				break;
			}
		} lws_end_foreach_ll(mi1, next);

		if (!mi) {

			/* no existing mirror instance for name */
			if (count_mi == MAX_MIRROR_INSTANCES) {
				lws_pthread_mutex_unlock(&v->lock); /* } vh lock */
				return -1;
			}

			/* create one with this name, and join it */
			mi = malloc(sizeof(*mi));
			if (!mi)
				goto bail1;
			memset(mi, 0, sizeof(*mi));
			mi->ring = lws_ring_create(sizeof(struct a_message),
						   QUEUELEN,
						   __mirror_destroy_message);
			if (!mi->ring) {
				free(mi);
				goto bail1;
			}

			mi->next = v->mi_list;
			v->mi_list = mi;
			lws_snprintf(mi->name, sizeof(mi->name) - 1, "%s", pn);
			mi->rx_enabled = 1;

			lws_pthread_mutex_init(&mi->lock);

			lwsl_notice("Created new mi %p '%s'\n", mi, pn);
		}

		/* add our pss to list of guys bound to this mi */

		lws_ll_fwd_insert(pss, same_mi_pss_list, mi->same_mi_pss_list);

		/* init the pss */

		pss->mi = mi;
		pss->tail = lws_ring_get_oldest_tail(mi->ring);
		pss->wsi = wsi;

		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		break;

bail1:
		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		return 1;

	case LWS_CALLBACK_CLOSED:
		/* detach our pss from the mirror instance */
		mi = pss->mi;
		if (!mi)
			break;

		lws_pthread_mutex_lock(&v->lock); /* vhost lock { */

		/* remove our closing pss from its mirror instance list */
		lws_ll_fwd_remove(struct per_session_data__lws_mirror,
				  same_mi_pss_list, pss, mi->same_mi_pss_list);
		pss->mi = NULL;

		if (mi->same_mi_pss_list) {
			/*
			 * Still other pss using the mirror instance.  The pss
			 * going away may have had the oldest tail, reconfirm
			 * using the remaining pss what is the current oldest
			 * tail.  If the oldest tail moves on, this call also
			 * will re-enable rx flow control when appropriate.
			 */
			lws_pthread_mutex_lock(&mi->lock); /* mi lock { */
			__mirror_update_worst_tail(mi);
			lws_pthread_mutex_unlock(&mi->lock); /* } mi lock */
			lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
			break;
		}

		/* No more pss using the mirror instance... delete mi */

		lws_start_foreach_llp(struct mirror_instance **,
				pmi, v->mi_list) {
			if (*pmi == mi) {
				*pmi = (*pmi)->next;

				lws_ring_destroy(mi->ring);
				lws_pthread_mutex_destroy(&mi->lock);

				free(mi);
				break;
			}
		} lws_end_foreach_llp(pmi, next);

		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		break;

	case LWS_CALLBACK_CONFIRM_EXTENSION_OKAY:
		return 1; /* disallow compression */

	case LWS_CALLBACK_PROTOCOL_INIT: /* per vhost */
		lws_protocol_vh_priv_zalloc(lws_get_vhost(wsi),
				lws_get_protocol(wsi),
				sizeof(struct per_vhost_data__lws_mirror));
		v = (struct per_vhost_data__lws_mirror *)
				lws_protocol_vh_priv_get(lws_get_vhost(wsi),
							 lws_get_protocol(wsi));
		lws_pthread_mutex_init(&v->lock);
		break;

	case LWS_CALLBACK_PROTOCOL_DESTROY:
		lws_pthread_mutex_destroy(&v->lock);
		break;

	case LWS_CALLBACK_SERVER_WRITEABLE:
		lws_pthread_mutex_lock(&pss->mi->lock); /* instance lock { */
		oldest_tail = lws_ring_get_oldest_tail(pss->mi->ring);
		update_worst = oldest_tail == pss->tail;
		sent_something = 0;

		do {
			msg = lws_ring_get_element(pss->mi->ring, &pss->tail);
			if (!msg)
				break;

			if (!msg->payload) {
				lwsl_err("%s: NULL payload: worst = %d,"
					 " pss->tail = %d\n", __func__,
					 oldest_tail, pss->tail);
				if (lws_ring_consume(pss->mi->ring, &pss->tail,
						     NULL, 1))
					continue;
				break;
			}

			n = lws_write(wsi, (unsigned char *)msg->payload +
				      LWS_PRE, msg->len, LWS_WRITE_TEXT);
			if (n < 0) {
				lwsl_info("%s: WRITEABLE: %d\n", __func__, n);

				goto bail2;
			}
			sent_something = 1;
			lws_ring_consume(pss->mi->ring, &pss->tail, NULL, 1);

		} while (!lws_send_pipe_choked(wsi));

		/* if any left for us to send, ask for writeable again */
		if (lws_ring_get_count_waiting_elements(pss->mi->ring,
							&pss->tail))
			lws_callback_on_writable(wsi);

		if (!sent_something || !update_worst)
			goto done1;

		/*
		 * We are no longer holding the oldest tail (since we sent
		 * something.  So free us of the timeout related to hogging the
		 * oldest tail.
		 */
		lws_set_timeout(pss->wsi, NO_PENDING_TIMEOUT, 0);
		/*
		 * If we were originally at the oldest fifo position of
		 * all the tails, now we used some up we may have
		 * changed the oldest fifo position and made some space.
		 */
		__mirror_update_worst_tail(pss->mi);

done1:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } instance lock */
		break;

bail2:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } instance lock */

		return -1;

	case LWS_CALLBACK_RECEIVE:
		lws_pthread_mutex_lock(&pss->mi->lock); /* mi lock { */
		n = (int)lws_ring_get_count_free_elements(pss->mi->ring);
		if (!n) {
			lwsl_notice("dropping!\n");
			if (pss->mi->rx_enabled)
				__mirror_rxflow_instance(pss->mi, 0);
			goto req_writable;
		}

		amsg.payload = malloc(LWS_PRE + len);
		amsg.len = len;
		if (!amsg.payload) {
			lwsl_notice("OOM: dropping\n");
			goto done2;
		}

		memcpy((char *)amsg.payload + LWS_PRE, in, len);
		if (!lws_ring_insert(pss->mi->ring, &amsg, 1)) {
			__mirror_destroy_message(&amsg);
			lwsl_notice("dropping!\n");
			if (pss->mi->rx_enabled)
				__mirror_rxflow_instance(pss->mi, 0);
			goto req_writable;
		}

		if (pss->mi->rx_enabled &&
		    lws_ring_get_count_free_elements(pss->mi->ring) <
								    RXFLOW_MIN)
			__mirror_rxflow_instance(pss->mi, 0);

req_writable:
		__mirror_callback_all_in_mi_on_writable(pss->mi);

done2:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } mi lock */
		break;

	case LWS_CALLBACK_EVENT_WAIT_CANCELLED:
		lwsl_info("LWS_CALLBACK_EVENT_WAIT_CANCELLED\n");
		break;

	default:
		break;
	}

	return 0;
}